

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XorHandler.h
# Opt level: O2

int __thiscall TCLAP::XorHandler::check(XorHandler *this,Arg *a)

{
  pointer pvVar1;
  Arg **ppAVar2;
  Arg *pAVar3;
  uint uVar4;
  int iVar5;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_> _Var6;
  CmdLineParseException *this_00;
  ArgVectorIterator it;
  Arg **ppAVar7;
  ulong uVar8;
  Arg **ppAVar9;
  long lVar10;
  allocator<char> local_79;
  Arg *a_local;
  string local_70;
  string local_50;
  
  lVar10 = 8;
  uVar8 = 0;
  a_local = a;
  while( true ) {
    pvVar1 = (this->_orList).
             super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_orList).
                       super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= uVar8)
    {
      uVar4 = (*a_local->_vptr_Arg[5])();
      return uVar4 & 0xff;
    }
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<TCLAP::Arg**,std::vector<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>,__gnu_cxx::__ops::_Iter_equals_val<TCLAP::Arg_const*const>>
                      (*(undefined8 *)((long)pvVar1 + lVar10 + -8),
                       *(undefined8 *)
                        ((long)&(pvVar1->
                                super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar10),&a_local);
    pvVar1 = (this->_orList).
             super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppAVar2 = *(Arg ***)((long)&(pvVar1->
                                super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar10);
    if (_Var6._M_current != ppAVar2) break;
    uVar8 = uVar8 + 1;
    lVar10 = lVar10 + 0x18;
  }
  ppAVar7 = *(Arg ***)((long)pvVar1 + lVar10 + -8);
  for (ppAVar9 = ppAVar7; ppAVar9 != ppAVar2; ppAVar9 = ppAVar9 + 1) {
    pAVar3 = *ppAVar9;
    if (((a_local != pAVar3) && (pAVar3->_alreadySet == true)) && (pAVar3->_xorSet == false)) {
      this_00 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Mutually exclusive argument already set!",&local_79);
      (*(*ppAVar9)->_vptr_Arg[7])(&local_70);
      CmdLineParseException::CmdLineParseException(this_00,&local_50,&local_70);
      __cxa_throw(this_00,&CmdLineParseException::typeinfo,ArgException::~ArgException);
    }
  }
  for (; ppAVar7 != ppAVar2; ppAVar7 = ppAVar7 + 1) {
    pAVar3 = *ppAVar7;
    if (a_local != pAVar3) {
      pAVar3->_alreadySet = true;
      pAVar3->_xorSet = true;
    }
  }
  iVar5 = (*(*_Var6._M_current)->_vptr_Arg[0xb])();
  if ((char)iVar5 != '\0') {
    return 0;
  }
  pvVar1 = (this->_orList).
           super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return (uint)((ulong)(*(long *)((long)&(pvVar1->
                                         super__Vector_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start + lVar10) -
                       *(long *)((long)pvVar1 + lVar10 + -8)) >> 3);
}

Assistant:

inline int XorHandler::check( const Arg* a ) 
{
	// iterate over each XOR list
	for ( int i = 0; static_cast<unsigned int>(i) < _orList.size(); i++ )
	{
		// if the XOR list contains the arg..
		ArgVectorIterator ait = std::find( _orList[i].begin(), 
		                                   _orList[i].end(), a );
		if ( ait != _orList[i].end() )
		{
			// first check to see if a mutually exclusive switch
			// has not already been set
			for ( ArgVectorIterator it = _orList[i].begin(); 
				  it != _orList[i].end(); 
				  it++ )
				if ( a != (*it) && (*it)->isSet() )
					throw(CmdLineParseException(
					      "Mutually exclusive argument already set!",
					      (*it)->toString()));

			// go through and set each arg that is not a
			for ( ArgVectorIterator it = _orList[i].begin(); 
				  it != _orList[i].end(); 
				  it++ )
				if ( a != (*it) )
					(*it)->xorSet();

			// return the number of required args that have now been set
			if ( (*ait)->allowMore() )
				return 0;
			else
				return static_cast<int>(_orList[i].size());
		}
	}

	if ( a->isRequired() )
		return 1;
	else
		return 0;
}